

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExportTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLExportTest_writeValueArrayTest_Test::TestBody
          (OpenDDLExportTest_writeValueArrayTest_Test *this)

{
  OpenDDLExport *this_00;
  DataArrayList *pDVar1;
  bool bVar2;
  char *pcVar3;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  char *in_R9;
  char *end;
  AssertHelper local_c0;
  AssertionResult gtest_ar__2;
  AssertHelper local_a8;
  AssertionResult gtest_ar;
  AssertHelper local_80;
  ValueType type;
  DataArrayList *dataArrayList;
  string statement;
  char token [30];
  OpenDDLExportMock myExporter;
  
  OpenDDLExportMock::OpenDDLExportMock(&myExporter);
  statement._M_dataplus._M_p = (pointer)&statement.field_2;
  statement._M_string_length = 0;
  statement.field_2._M_local_buf[0] = '\0';
  this_00 = &myExporter.super_OpenDDLExport;
  bVar2 = OpenDDLExport::writeValueArray(this_00,(DataArrayList *)0x0,&statement);
  token[8] = '\0';
  token[9] = '\0';
  token[10] = '\0';
  token[0xb] = '\0';
  token[0xc] = '\0';
  token[0xd] = '\0';
  token[0xe] = '\0';
  token[0xf] = '\0';
  token[0] = !bVar2;
  if (bVar2) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)token,(AssertionResult *)"ok","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0x11e,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(token + 8));
  token[8] = '\0';
  token[9] = '\0';
  token[10] = '\0';
  token[0xb] = '\0';
  token[0xc] = '\0';
  token[0xd] = '\0';
  token[0xe] = '\0';
  token[0xf] = '\0';
  token[0] = statement._M_string_length == 0;
  if (statement._M_string_length != 0) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)token,(AssertionResult *)"statement.empty()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0x11f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(token + 8));
  builtin_strncpy(token + 0x10," {1, 2, 3}\n}\n",0xe);
  builtin_strncpy(token,"float[ 3 ]\n{\n   ",0x10);
  local_a8.data_ = (AssertHelperData *)strlen(token);
  end = token + (long)local_a8.data_;
  dataArrayList = (DataArrayList *)0x0;
  pcVar3 = OpenDDLParser::parsePrimitiveDataType(token,end,&type,(size_t *)&local_a8);
  gtest_ar__2.success_ = true;
  gtest_ar__2._1_3_ = 0;
  testing::internal::CmpHelperEQ<ODDLParser::Value::ValueType,ODDLParser::Value::ValueType>
            ((internal *)&gtest_ar,"Value::ValueType::ddl_float","type",(ValueType *)&gtest_ar__2,
             &type);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0x12d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&gtest_ar__2);
LAB_00131d65:
    this_01 = &gtest_ar.message_;
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar__2.success_ = true;
    gtest_ar__2._1_3_ = 0;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)&gtest_ar,"3U","len",(uint *)&gtest_ar__2,(unsigned_long *)&local_a8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__2);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
                 ,0x12e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&gtest_ar__2);
      goto LAB_00131d65;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    OpenDDLParser::parseDataArrayList(pcVar3,end,type,&dataArrayList);
    this_01 = &gtest_ar__2.message_;
    gtest_ar__2.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar__2.success_ = dataArrayList != (DataArrayList *)0x0;
    if (gtest_ar__2.success_) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(this_01);
      gtest_ar__2.success_ = OpenDDLExport::writeValueArray(this_00,dataArrayList,&statement);
      gtest_ar__2.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!gtest_ar__2.success_) {
        testing::Message::Message((Message *)&local_c0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar__2,(AssertionResult *)"ok","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
                   ,0x133,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_c0);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        std::__cxx11::string::~string((string *)&gtest_ar);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_c0);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar__2.message_);
      testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
                ((internal *)&gtest_ar,"\"{ 1, 2, 3 }\"","statement",(char (*) [12])"{ 1, 2, 3 }",
                 &statement);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar__2);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
                   ,0x134,pcVar3);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&gtest_ar__2);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar__2);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      pDVar1 = dataArrayList;
      if (dataArrayList != (DataArrayList *)0x0) {
        DataArrayList::~DataArrayList(dataArrayList);
      }
      operator_delete(pDVar1,0x28);
      goto LAB_00131d86;
    }
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__2,
               (AssertionResult *)"nullptr == dataArrayList","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0x130,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_01);
LAB_00131d86:
  std::__cxx11::string::~string((string *)&statement);
  OpenDDLExport::~OpenDDLExport(this_00);
  return;
}

Assistant:

TEST_F(OpenDDLExportTest, writeValueArrayTest) {
    OpenDDLExportMock myExporter;
    bool ok(true);
    std::string statement;
    ok = myExporter.writeValueArrayTester(nullptr, statement);
    EXPECT_FALSE(ok);
    EXPECT_TRUE(statement.empty());

    char token[] =
            "float[ 3 ]\n"
            "{\n"
            "    {1, 2, 3}\n"
            "}\n";

    size_t len(0);
    char *end = findEnd(token, len);
    DataArrayList *dataArrayList = nullptr;
    Value::ValueType type;

    char *in = OpenDDLParser::parsePrimitiveDataType(token, end, type, len);
    ASSERT_EQ(Value::ValueType::ddl_float, type);
    ASSERT_EQ(3U, len);
    in = OpenDDLParser::parseDataArrayList(in, end, type, &dataArrayList);
    ASSERT_FALSE(nullptr == dataArrayList);

    ok = myExporter.writeValueArrayTester(dataArrayList, statement);
    EXPECT_TRUE(ok);
    EXPECT_EQ("{ 1, 2, 3 }", statement);
    delete dataArrayList;
}